

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O1

bool __thiscall TGAImage::flip_horizontally(TGAImage *this)

{
  int iVar1;
  uint uVar2;
  TGAColor TVar3;
  int iVar4;
  int y;
  uint x;
  TGAColor c2;
  TGAColor c1;
  uchar local_48 [4];
  uchar local_44;
  uchar local_40 [4];
  uchar local_3c;
  uchar *local_38;
  
  local_38 = this->data;
  if ((local_38 != (uchar *)0x0) && (uVar2 = this->width >> 1, 0 < (int)uVar2)) {
    x = 0;
    do {
      if (0 < this->height) {
        y = 0;
        do {
          TVar3 = get(this,x,y);
          local_40 = TVar3.bgra;
          local_3c = TVar3.bytespp;
          TVar3 = get(this,this->width + ~x,y);
          local_48 = TVar3.bgra;
          local_44 = TVar3.bytespp;
          if (((this->data != (uchar *)0x0) && ((int)x < this->width)) && (y < this->height)) {
            memcpy(this->data + (long)(int)(this->width * y + x) * (long)this->bytespp,local_48,
                   (long)this->bytespp);
          }
          iVar1 = this->width;
          iVar4 = iVar1 + ~x;
          if (((-1 < iVar4 && this->data != (uchar *)0x0) && (iVar4 < iVar1)) && (y < this->height))
          {
            memcpy(this->data + (long)(iVar1 * y + iVar4) * (long)this->bytespp,local_40,
                   (long)this->bytespp);
          }
          y = y + 1;
        } while (y < this->height);
      }
      x = x + 1;
    } while (x != uVar2);
  }
  return local_38 != (uchar *)0x0;
}

Assistant:

bool TGAImage::flip_horizontally() {
    if (!data) return false;
    int half = width>>1;
    for (int i=0; i<half; i++) {
        for (int j=0; j<height; j++) {
            TGAColor c1 = get(i, j);
            TGAColor c2 = get(width-1-i, j);
            set(i, j, c2);
            set(width-1-i, j, c1);
        }
    }
    return true;
}